

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

bool __thiscall glslang::TParseContext::isIoResizeArray(TParseContext *this,TType *type)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  byte local_2a;
  byte local_29;
  byte local_19;
  TType *type_local;
  TParseContext *this_local;
  
  uVar1 = (*type->_vptr_TType[0x1d])();
  local_19 = 0;
  if ((uVar1 & 1) == 0) goto LAB_0074fdc8;
  if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) {
    iVar2 = (*type->_vptr_TType[0xb])();
    local_29 = 1;
    if (((uint)*(undefined8 *)(CONCAT44(extraout_var,iVar2) + 8) & 0x7f) != 3) goto LAB_0074fcc2;
  }
  else {
LAB_0074fcc2:
    if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl) &&
       (iVar2 = (*type->_vptr_TType[0xb])(),
       ((uint)*(undefined8 *)(CONCAT44(extraout_var_00,iVar2) + 8) & 0x7f) == 4)) {
      iVar2 = (*type->_vptr_TType[0xb])();
      local_29 = 1;
      if ((*(ulong *)(CONCAT44(extraout_var_01,iVar2) + 8) >> 0x2c & 1) == 0) goto LAB_0074fdc2;
    }
    if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) &&
       (iVar2 = (*type->_vptr_TType[0xb])(),
       ((uint)*(undefined8 *)(CONCAT44(extraout_var_02,iVar2) + 8) & 0x7f) == 3)) {
      iVar2 = (*type->_vptr_TType[0xb])();
      local_29 = 1;
      if ((*(ulong *)(CONCAT44(extraout_var_03,iVar2) + 8) >> 0x27 & 1) == 0) {
        iVar2 = (*type->_vptr_TType[0xb])();
        local_29 = 1;
        if ((*(ulong *)(CONCAT44(extraout_var_04,iVar2) + 8) >> 0x28 & 1) == 0) goto LAB_0074fd74;
      }
    }
    else {
LAB_0074fd74:
      local_2a = 0;
      if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh) {
        iVar2 = (*type->_vptr_TType[0xb])();
        local_2a = 0;
        if (((uint)*(undefined8 *)(CONCAT44(extraout_var_05,iVar2) + 8) & 0x7f) == 4) {
          iVar2 = (*type->_vptr_TType[0xb])();
          local_2a = (byte)(*(ulong *)(CONCAT44(extraout_var_06,iVar2) + 8) >> 0x2b) & 1 ^ 0xff;
        }
      }
      local_29 = local_2a;
    }
  }
LAB_0074fdc2:
  local_19 = local_29;
LAB_0074fdc8:
  return (bool)(local_19 & 1);
}

Assistant:

bool TParseContext::isIoResizeArray(const TType& type) const
{
    return type.isArray() &&
           ((language == EShLangGeometry    && type.getQualifier().storage == EvqVaryingIn) ||
            (language == EShLangTessControl && type.getQualifier().storage == EvqVaryingOut &&
                ! type.getQualifier().patch) ||
            (language == EShLangFragment && type.getQualifier().storage == EvqVaryingIn &&
                (type.getQualifier().pervertexNV || type.getQualifier().pervertexEXT)) ||
            (language == EShLangMesh && type.getQualifier().storage == EvqVaryingOut &&
                !type.getQualifier().perTaskNV));
}